

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,integer_type x,integer_format_info *fmt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *com,region_type *reg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  size_t sVar3;
  size_type sVar4;
  size_type sVar5;
  size_t sVar6;
  pointer pbVar7;
  ulong *local_40;
  ulong local_30;
  undefined8 uStack_28;
  
  this->type_ = integer;
  sVar3 = fmt->spacer;
  sVar5 = *(size_type *)fmt;
  sVar6 = fmt->width;
  local_40 = (ulong *)(fmt->suffix)._M_dataplus._M_p;
  paVar1 = &(fmt->suffix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40 == paVar1) {
    local_30 = paVar1->_M_allocated_capacity;
    uStack_28 = *(undefined8 *)((long)&(fmt->suffix).field_2 + 8);
    local_40 = &local_30;
  }
  else {
    local_30 = paVar1->_M_allocated_capacity;
  }
  sVar4 = (fmt->suffix)._M_string_length;
  (fmt->suffix)._M_dataplus._M_p = (pointer)paVar1;
  (fmt->suffix)._M_string_length = 0;
  (fmt->suffix).field_2._M_local_buf[0] = '\0';
  (this->field_1).integer_.value = x;
  (this->field_1).string_.value._M_string_length = sVar5;
  (this->field_1).string_.value.field_2._M_allocated_capacity = sVar6;
  *(size_t *)((long)&(this->field_1).string_.value.field_2 + 8) = sVar3;
  puVar2 = (ulong *)((long)&this->field_1 + 0x30);
  *(ulong **)((long)&this->field_1 + 0x20) = puVar2;
  if (local_40 == &local_30) {
    *puVar2 = local_30;
    *(undefined8 *)((long)&this->field_1 + 0x38) = uStack_28;
  }
  else {
    *(ulong **)((long)&this->field_1 + 0x20) = local_40;
    *(ulong *)((long)&this->field_1 + 0x30) = local_30;
  }
  *(size_type *)((long)&this->field_1 + 0x28) = sVar4;
  local_30 = local_30 & 0xffffffffffffff00;
  detail::region::region(&this->region_,reg);
  pbVar7 = (com->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (com->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar7;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (com->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

basic_value(integer_type x, integer_format_info fmt, std::vector<std::string> com, region_type reg)
        : type_(value_t::integer), integer_(integer_storage(std::move(x), std::move(fmt))),
          region_(std::move(reg)), comments_(std::move(com))
    {}